

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O2

int getopt_next(getopt_context_t *ctx)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char **ppcVar4;
  getopt_option_t *pgVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  undefined8 *puVar14;
  ulong uVar15;
  ulong __n;
  float fVar16;
  char *end;
  char **local_48;
  char *local_40;
  char *local_38;
  
  iVar2 = ctx->current_index;
  iVar3 = ctx->argc;
  if (iVar2 == iVar3) {
    return -1;
  }
  ctx->current_opt_arg = (char *)0x0;
  ppcVar4 = ctx->argv;
  local_40 = ppcVar4[iVar2];
  iVar11 = iVar2 + 1;
  ctx->current_index = iVar11;
  if ((*local_40 != '\0') && (*local_40 != '-')) {
    ctx->current_opt_arg = local_40;
    return 0x2b;
  }
  cVar1 = local_40[1];
  if (cVar1 != '\0') {
    if (cVar1 == '-') {
      if (local_40[2] != '\0') {
        local_38 = local_40 + 2;
        uVar15 = 0;
        uVar7 = (ulong)(uint)ctx->num_opts;
        if (ctx->num_opts < 1) {
          uVar7 = uVar15;
        }
        local_48 = ppcVar4;
        for (; uVar7 * 0x30 - uVar15 != 0; uVar15 = uVar15 + 0x30) {
          pgVar5 = ctx->opts;
          pcVar13 = *(char **)((long)&pgVar5->name + uVar15);
          if (pcVar13 != (char *)0x0) {
            sVar8 = strlen(pcVar13);
            __n = sVar8 & 0xffffffff;
            iVar6 = strncasecmp(pcVar13,local_38,__n);
            if (iVar6 == 0) {
              uVar10 = *(uint *)((long)&pgVar5->type + uVar15);
              if (0xfffffff9 < uVar10 - 7) {
                if (local_38[__n] == '=') {
                  puVar14 = (undefined8 *)((long)&pgVar5->name + uVar15);
                  if (local_38[__n + 1] != '\0') {
                    pcVar13 = local_38 + __n + 1;
                    goto LAB_0013c888;
                  }
                  if (iVar3 <= iVar11) goto LAB_0013c7cc;
                  iVar3 = 2;
LAB_0013c7fd:
                  ctx->current_index = iVar3 + iVar2;
                  pcVar13 = local_48[iVar11];
                  puVar14 = (undefined8 *)((long)&pgVar5->name + uVar15);
                  if (pcVar13 == (char *)0x0) goto LAB_0013c7cc;
                  uVar10 = *(uint *)((long)&pgVar5->type + uVar15);
                  goto LAB_0013c888;
                }
                if (local_38[__n] != '\0') goto LAB_0013c6cf;
                puVar14 = (undefined8 *)((long)&pgVar5->name + uVar15);
                if (iVar11 < iVar3) {
                  pcVar13 = local_48[iVar11];
                  if (*pcVar13 == '=') {
                    iVar11 = iVar2 + 2;
                    ctx->current_index = iVar11;
                    if (pcVar13[1] != '\0') {
                      pcVar13 = pcVar13 + 1;
                      goto LAB_0013c888;
                    }
                    if (iVar11 < iVar3) {
                      iVar3 = 3;
                      goto LAB_0013c7fd;
                    }
                    goto LAB_0013c7cc;
                  }
                  if (*pcVar13 != '-') {
                    ctx->current_index = iVar2 + 2;
                    goto LAB_0013c888;
                  }
                }
              }
              puVar14 = (undefined8 *)((long)&pgVar5->name + uVar15);
              goto LAB_0013c7cc;
            }
          }
LAB_0013c6cf:
        }
LAB_0013c755:
        ctx->current_opt_arg = local_40;
        return 0x3f;
      }
    }
    else if (local_40[2] == '\0') {
      uVar10 = 0;
      if (0 < ctx->num_opts) {
        uVar10 = ctx->num_opts;
      }
      lVar9 = -0x30;
      do {
        lVar12 = lVar9;
        if ((ulong)uVar10 * 0x30 - (lVar12 + 0x30) == 0) goto LAB_0013c755;
        pgVar5 = ctx->opts;
        lVar9 = lVar12 + 0x30;
      } while (*(int *)((long)&pgVar5[1].name_short + lVar12) != (int)cVar1);
      puVar14 = (undefined8 *)((long)&pgVar5[1].name + lVar12);
      if (((iVar11 != iVar3) && (pcVar13 = ppcVar4[(long)iVar2 + 1], *pcVar13 != '-')) &&
         (uVar10 = *(uint *)((long)&pgVar5[1].type + lVar12), 0xfffffff9 < uVar10 - 7)) {
        ctx->current_index = iVar2 + 2;
LAB_0013c888:
        ctx->current_opt_arg = pcVar13;
        if (9 < uVar10) {
          return -1;
        }
        if ((0x78U >> (uVar10 & 0x1f) & 1) == 0) {
          if ((0x381U >> (uVar10 & 0x1f) & 1) != 0) {
            ctx->current_opt_arg = (char *)0x0;
            return 0x2b;
          }
        }
        else {
          end = (char *)0x0;
          if (uVar10 - 3 < 2) {
            lVar9 = strtol(pcVar13,&end,0);
            fVar16 = (float)lVar9;
          }
          else {
            fVar16 = strtof(pcVar13,&end);
          }
          (ctx->current_value).i32 = (int)fVar16;
          if (*end != '\0') goto switchD_0013c7e5_caseD_1;
        }
switchD_0013c7e5_caseD_0:
        return *(int *)(puVar14 + 3);
      }
LAB_0013c7cc:
      switch(*(undefined4 *)((long)puVar14 + 0xc)) {
      case 0:
      case 2:
      case 4:
      case 6:
        goto switchD_0013c7e5_caseD_0;
      case 1:
      case 3:
      case 5:
switchD_0013c7e5_caseD_1:
        ctx->current_opt_arg = (char *)*puVar14;
        return 0x21;
      case 7:
        *(undefined4 *)puVar14[2] = *(undefined4 *)(puVar14 + 3);
        break;
      case 8:
        *(uint *)puVar14[2] = *(uint *)puVar14[2] & *(uint *)(puVar14 + 3);
        break;
      case 9:
        *(uint *)puVar14[2] = *(uint *)puVar14[2] | *(uint *)(puVar14 + 3);
        break;
      default:
        return -1;
      }
      return 0;
    }
  }
  ctx->current_opt_arg = local_40;
  return 0x21;
}

Assistant:

int getopt_next( getopt_context_t* ctx )
{
	/* are all options processed? */
	if(ctx->current_index == ctx->argc )
		return -1;

	/* reset opt-arg */
	ctx->current_opt_arg = 0x0;

	const char* curr_token = ctx->argv[ ctx->current_index ];
	
	/* this token has been processed! */
	ctx->current_index++;

	/* check if item is no option */
	if( curr_token[0] && curr_token[0] != '-' )
	{
		ctx->current_opt_arg = curr_token;
		return '+'; /* return '+' as identifier for no option! */
	}
	
	const getopt_option_t* found_opt = 0x0;
	const char* found_arg = 0x0;

	/* short opt */
	if( curr_token[1] != '\0' && curr_token[1] != '-' && curr_token[2] == '\0' )
	{
		int i = 0;
		for( ; i < ctx->num_opts; i++ )
		{
			const getopt_option_t* opt = ctx->opts + i;

			if( opt->name_short == curr_token[1] )
			{
				found_opt = opt;

				/* if there is an value when: - current_index < argc and value in argv[current_index] do not start with '-' */
				if( ( ( ctx->current_index != ctx->argc) && ( ctx->argv[ctx->current_index][0] != '-' ) ) && 
					  getopt_opt_might_have_arg(opt) )
				{
					found_arg = ctx->argv[ctx->current_index];
					ctx->current_index++; /* next token has been processed aswell! */
				}
				break;
			}
		}
	}
	/* long opt */
	else if(curr_token[1] == '-' && curr_token[2] != '\0')
	{
		int i = 0;
		for( ; i < ctx->num_opts; i++ )
		{
			const char* check_option = curr_token + 2;

			const getopt_option_t* opt = ctx->opts + i;

			if(!opt->name)
				continue;

			unsigned int name_len = (unsigned int)strlen( opt->name );

			if( str_case_cmp_len( opt->name, check_option, name_len ) == 0 )
			{
				check_option += name_len;

				/* find arg if there is any */
				if(getopt_opt_might_have_arg(opt))
				{
					switch( *check_option )
					{
						case '\0':
						{
							if( ctx->current_index < ctx->argc ) /* are there more tokens that can contain the '='? */
							{
								const char* next_token = ctx->argv[ ctx->current_index ];
								if( next_token[0] == '=' )
								{
									ctx->current_index++; /* next token has been processed aswell! */

									if( next_token[1] != '\0' ) /* does this token contain the arg-value? */
										found_arg = next_token + 1;
									else if( ctx->current_index < ctx->argc )
										found_arg = ctx->argv[ ctx->current_index++ ]; /* next token has been processed aswell! */
								}
								else if( next_token[0] != '-' )
								{
									ctx->current_index++; /* next token has been processed aswell! */
									found_arg = next_token;
								}
							}
						}
						break;
						case '=':
							if( check_option[1] != '\0' )
								found_arg = check_option + 1;
							else if( ctx->current_index < ctx->argc )
								found_arg = ctx->argv[ ctx->current_index++ ]; /* next token has been processed aswell! */
						break;
						default:
							/* not found, matched for example --test but it was --testing*/
							continue;
					}
				}

				found_opt = opt;
				break;
			}
		}
	}
	/* malformed opt "-", "-xyz" or "--" */
	else
	{
		ctx->current_opt_arg = curr_token;
		return '!';
	}

	/* found no matching option! */
	if(found_opt == 0x0)
	{
		ctx->current_opt_arg = curr_token;
		return '?';
	}

	if(found_arg != 0x0)
	{
		ctx->current_opt_arg = found_arg;

		switch(found_opt->type)
		{
			case GETOPT_OPTION_TYPE_FLAG_SET:
			case GETOPT_OPTION_TYPE_FLAG_AND:
			case GETOPT_OPTION_TYPE_FLAG_OR:
			case GETOPT_OPTION_TYPE_NO_ARG:
				/* these types should have no argument, usage error! */
				ctx->current_opt_arg = 0x0;
				return '+';

			case GETOPT_OPTION_TYPE_OPTIONAL:
			case GETOPT_OPTION_TYPE_REQUIRED:
				return found_opt->value;
			case GETOPT_OPTION_TYPE_OPTIONAL_INT32:
			case GETOPT_OPTION_TYPE_REQUIRED_INT32:
			case GETOPT_OPTION_TYPE_OPTIONAL_FP32:
			case GETOPT_OPTION_TYPE_REQUIRED_FP32:
				return getopt_read_value(ctx, found_opt);
		}
	}
	/* no argument found */
	else
	{
		switch(found_opt->type)
		{
			case GETOPT_OPTION_TYPE_FLAG_SET: *found_opt->flag  = found_opt->value; return 0;
			case GETOPT_OPTION_TYPE_FLAG_AND: *found_opt->flag &= found_opt->value; return 0;
			case GETOPT_OPTION_TYPE_FLAG_OR:  *found_opt->flag |= found_opt->value; return 0; /* zero is "a flag was set!" */
			
			case GETOPT_OPTION_TYPE_NO_ARG:
			case GETOPT_OPTION_TYPE_OPTIONAL:
			case GETOPT_OPTION_TYPE_OPTIONAL_INT32:
			case GETOPT_OPTION_TYPE_OPTIONAL_FP32:
				return found_opt->value;

			/* the option requires an argument! (--option=arg, -o arg) */
			case GETOPT_OPTION_TYPE_REQUIRED:
			case GETOPT_OPTION_TYPE_REQUIRED_INT32:
			case GETOPT_OPTION_TYPE_REQUIRED_FP32:
				ctx->current_opt_arg = found_opt->name;
				return '!';
		}
	}

 	return -1;
}